

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O0

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::ProcessStartStateList::ProcessList
          (ProcessStartStateList *this)

{
  bool bVar1;
  POMDPDiscrete *pPVar2;
  reference puVar3;
  reference pvVar4;
  MultiAgentDecisionProcessDiscrete *this_00;
  long *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  StateDistributionVector *isd;
  iterator last;
  iterator it;
  vector<double,_std::allocator<double>_> init_probs;
  double u_prob;
  size_t nrIncS;
  size_t listSize;
  size_t nrS;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffef8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffff00;
  StateDistributionVector *in_stack_ffffffffffffff08;
  StateDistributionVector *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  size_type __n;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  vector<double,_std::allocator<double>_> *this_01;
  size_type local_c8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a0;
  vector<double,_std::allocator<double>_> local_91 [2];
  undefined8 local_60;
  vector<double,_std::allocator<double>_> local_40;
  StateDistributionVector *local_28;
  size_type local_20;
  size_type local_18;
  size_type local_10;
  undefined1 auVar6 [64];
  undefined1 auVar5 [16];
  
  pPVar2 = GetPOMDPDiscrete((ParserPOMDPFormat_Spirit *)*in_RDI);
  local_10 = (**(code **)(*(long *)&(pPVar2->super_DecPOMDPDiscrete).
                                    super_MultiAgentDecisionProcessDiscrete.
                                    super_MultiAgentDecisionProcess + 0x30))();
  auVar6._8_56_ = extraout_var;
  auVar6._0_8_ = extraout_XMM0_Qa;
  auVar5 = auVar6._0_16_;
  local_18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x130));
  local_c8 = local_18;
  if ((*(byte *)(*in_RDI + 0x148) & 1) != 0) {
    local_c8 = local_10 - local_18;
  }
  local_20 = local_c8;
  auVar5 = vcvtusi2sd_avx512f(auVar5,local_c8);
  local_28 = (StateDistributionVector *)(1.0 / auVar5._0_8_);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0xa72aa3);
  if ((*(byte *)(*in_RDI + 0x148) & 1) == 0) {
    local_60 = 0;
    std::allocator<double>::allocator((allocator<double> *)0xa72ae3);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (value_type_conflict3 *)in_stack_ffffffffffffff10,
               (allocator_type *)in_stack_ffffffffffffff08);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff08);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10);
    std::allocator<double>::~allocator((allocator<double> *)0xa72b33);
  }
  else {
    this_01 = local_91;
    __n = local_10;
    std::allocator<double>::allocator((allocator<double> *)0xa72b7a);
    std::vector<double,_std::allocator<double>_>::vector
              (this_01,__n,(value_type_conflict3 *)in_stack_ffffffffffffff10,
               (allocator_type *)in_stack_ffffffffffffff08);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff08);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10);
    std::allocator<double>::~allocator((allocator<double> *)0xa72bbe);
  }
  local_a0._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (in_stack_fffffffffffffef8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_fffffffffffffef8);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff00,
                            (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)in_stack_fffffffffffffef8), bVar1) {
    in_stack_ffffffffffffff08 = local_28;
    if ((*(byte *)(*in_RDI + 0x148) & 1) != 0) {
      in_stack_ffffffffffffff08 = (StateDistributionVector *)0x0;
    }
    in_stack_ffffffffffffff10 = in_stack_ffffffffffffff08;
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_a0);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(ulong)*puVar3);
    *pvVar4 = (value_type)in_stack_ffffffffffffff08;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  }
  this_00 = (MultiAgentDecisionProcessDiscrete *)operator_new(0x20);
  StateDistributionVector::StateDistributionVector
            (in_stack_ffffffffffffff10,(SDV *)in_stack_ffffffffffffff08);
  GetPOMDPDiscrete((ParserPOMDPFormat_Spirit *)*in_RDI);
  MultiAgentDecisionProcessDiscrete::SetISD(this_00,(StateDistribution *)in_stack_fffffffffffffef8);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0xa72cf8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa72d0c);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10);
  return;
}

Assistant:

void ProcessList() const
            {
                size_t nrS = _m_po->GetPOMDPDiscrete()->GetNrStates();
                size_t listSize = _m_po->_m_startStateListSI.size();
                size_t nrIncS = (_m_po->_m_startStateListExclude)? nrS - listSize:
                    listSize;
                double u_prob = 1.0 / nrIncS;
                
                std::vector<double> init_probs;
                if(!_m_po->_m_startStateListExclude)
                    //elems in list get uniform prob.
                    init_probs = std::vector<double>(nrS, 0.0);
                else //other elems get uniform prob
                    init_probs = std::vector<double>(nrS, u_prob);

                std::vector<Index>::iterator it = _m_po->_m_startStateListSI.begin();
                std::vector<Index>::iterator last = _m_po->_m_startStateListSI.end();
                while(it != last)
                {
                    init_probs[*it] = _m_po->_m_startStateListExclude? 
                        0.0 : u_prob;
                    it++;
                }
                StateDistributionVector *isd=new StateDistributionVector(init_probs);
                _m_po->GetPOMDPDiscrete()->SetISD(isd);
                init_probs.clear();                
                _m_po->_m_startStateListSI.clear();

            }